

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall FTOutline::cubicTo(FTOutline *this,VPointF *cp1,VPointF *cp2,VPointF ep)

{
  short *psVar1;
  SW_FT_Vector *pSVar2;
  short sVar3;
  
  pSVar2 = (this->ft).points;
  sVar3 = (this->ft).n_points;
  pSVar2[sVar3].x = (long)(cp1->mx * 64.0);
  pSVar2[sVar3].y = (long)(cp1->my * 64.0);
  (this->ft).tags[sVar3] = '\x02';
  sVar3 = (this->ft).n_points + 1;
  (this->ft).n_points = sVar3;
  pSVar2 = (this->ft).points;
  pSVar2[sVar3].x = (long)(cp2->mx * 64.0);
  pSVar2[sVar3].y = (long)(cp2->my * 64.0);
  (this->ft).tags[sVar3] = '\x02';
  sVar3 = (this->ft).n_points + 1;
  (this->ft).n_points = sVar3;
  pSVar2 = (this->ft).points;
  pSVar2[sVar3].x = (long)(ep.mx * 64.0);
  pSVar2[sVar3].y = (long)(ep.my * 64.0);
  (this->ft).tags[sVar3] = '\x01';
  psVar1 = &(this->ft).n_points;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void FTOutline::cubicTo(const VPointF &cp1, const VPointF &cp2,
                        const VPointF ep)
{
    assert(ft.n_points <= SHRT_MAX - 3);

    ft.points[ft.n_points].x = TO_FT_COORD(cp1.x());
    ft.points[ft.n_points].y = TO_FT_COORD(cp1.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_CUBIC;
    ft.n_points++;

    ft.points[ft.n_points].x = TO_FT_COORD(cp2.x());
    ft.points[ft.n_points].y = TO_FT_COORD(cp2.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_CUBIC;
    ft.n_points++;

    ft.points[ft.n_points].x = TO_FT_COORD(ep.x());
    ft.points[ft.n_points].y = TO_FT_COORD(ep.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}